

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O2

void luaV_execute(lua_State *L,int nexeccalls)

{
  undefined8 uVar1;
  byte bVar2;
  global_State *pgVar3;
  void *pvVar4;
  Value *pVVar5;
  CallInfo *pCVar6;
  int iVar7;
  int iVar8;
  GCObject *pGVar9;
  GCObject *pGVar10;
  ulong uVar11;
  GCObject *pGVar12;
  TValue *pTVar13;
  TValue *pTVar14;
  TValue *pTVar15;
  uint *obj;
  StkId pTVar16;
  StkId pTVar17;
  ulong uVar18;
  StkId pTVar19;
  long lVar20;
  TValue *obj_00;
  uint uVar21;
  char *pcVar22;
  lua_State *L_00;
  TMS op;
  uint *puVar23;
  uint *puVar24;
  uint uVar25;
  GCObject *unaff_R13;
  TValue *i_o;
  int *piVar26;
  uint uVar27;
  TValue *o1_2;
  long *plVar28;
  double dVar29;
  lua_Number lVar30;
  TValue TStack_c8;
  TValue TStack_b8;
  lua_State *plStack_a8;
  TValue *pTStack_a0;
  GCObject *pGStack_98;
  TValue *pTStack_90;
  ulong uStack_88;
  code *pcStack_80;
  uint *local_78;
  StkId local_70;
  lua_State *local_68;
  GCObject *local_60;
  int local_54;
  double local_50;
  double local_48;
  TValue g;
  
  local_68 = L;
  local_54 = nexeccalls;
LAB_001158b4:
  pTVar16 = L->base;
  local_60 = (L->ci->func->value).gc;
  local_70 = (StkId)((local_60->th).l_G)->frealloc;
  local_78 = L->savedpc;
LAB_001158d9:
  do {
    puVar23 = local_78;
    local_78 = puVar23 + 1;
    uVar21 = *puVar23;
    bVar2 = L->hookmask;
    if ((bVar2 & 0xc) != 0) {
      iVar7 = L->hookcount + -1;
      L->hookcount = iVar7;
      if ((bVar2 & 4) != 0 || iVar7 == 0) {
        puVar24 = L->savedpc;
        L->savedpc = local_78;
        if ((bVar2 & 8) != 0 && iVar7 == 0) {
          L->hookcount = L->basehookcount;
          pcStack_80 = (code *)0x11593d;
          luaD_callhook(L,3,-1);
        }
        if ((bVar2 & 4) != 0) {
          pgVar3 = (((L->ci->func->value).gc)->th).l_G;
          pvVar4 = pgVar3->ud;
          pGVar12 = pgVar3->rootgc;
          iVar7 = (int)((ulong)((long)local_78 - (long)pvVar4) >> 2) + -1;
          if (pGVar12 == (GCObject *)0x0) {
            iVar8 = 0;
            if ((iVar7 == 0) || (local_78 <= puVar24)) goto LAB_001159a9;
          }
          else {
            iVar8 = *(int *)((long)pGVar12 + (long)iVar7 * 4);
            if ((iVar7 == 0) ||
               ((local_78 <= puVar24 ||
                (iVar8 != *(int *)((long)pGVar12 +
                                  (((long)puVar24 - (long)pvVar4) * 0x40000000 + -0x100000000 >>
                                  0x20) * 4))))) {
LAB_001159a9:
              pcStack_80 = (code *)0x1159b4;
              luaD_callhook(L,2,iVar8);
            }
          }
        }
        if (L->status == '\x01') {
          L->savedpc = puVar23;
          return;
        }
        pTVar16 = L->base;
      }
    }
    pGVar12 = local_60;
    puVar24 = local_78;
  } while (0x25 < (uVar21 & 0x3f));
  uVar27 = uVar21 >> 6 & 0xff;
  pTVar14 = (TValue *)((long)&pTVar16->value + (ulong)(uVar27 << 4));
  obj = &switchD_001159f5::switchdataD_0011d154;
  switch(uVar21 & 0x3f) {
  case 0:
    uVar11 = (ulong)(uVar21 >> 0x13 & 0xfffffff0);
    pTVar14->value = *(Value *)((long)&pTVar16->value + uVar11);
    pTVar14->tt = *(int *)((long)&pTVar16->tt + uVar11);
    goto LAB_001158d9;
  case 1:
    uVar11 = (ulong)(uVar21 >> 10 & 0xfffffff0);
    pTVar14->value = *(Value *)((long)&local_70->value + uVar11);
    pTVar14->tt = *(int *)((long)&local_70->tt + uVar11);
    goto LAB_001158d9;
  case 2:
    (pTVar14->value).b = uVar21 >> 0x17;
    pTVar14->tt = 1;
    if ((uVar21 & 0x7fc000) != 0) {
      local_78 = puVar23 + 2;
    }
    goto LAB_001158d9;
  case 3:
    pTVar15 = (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    do {
      pTVar15->tt = 0;
      pTVar15 = pTVar15 + -1;
    } while (pTVar14 <= pTVar15);
    goto LAB_001158d9;
  case 4:
    pVVar5 = (Value *)((&(&local_60->uv)[1].next)[uVar21 >> 0x17]->h).metatable;
    pTVar14->value = *pVVar5;
    pTVar14->tt = pVVar5[1].b;
    goto LAB_001158d9;
  case 5:
    pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar21 >> 10 & 0xfffffff0));
    g.value = (Value)(local_60->h).array;
    pTVar15 = &g;
    g.tt = 5;
    L->savedpc = local_78;
    goto LAB_0011619f;
  case 6:
    uVar11 = (ulong)(uVar21 >> 0x13 & 0xfffffff0);
    goto LAB_00116185;
  case 7:
    g.value = (Value)(local_60->h).array;
    pTVar13 = &g;
    g.tt = 5;
    L->savedpc = local_78;
    pTVar15 = (TValue *)((long)&local_70->value + (ulong)(uVar21 >> 10 & 0xfffffff0));
    pTVar16 = pTVar14;
    goto LAB_00115e6c;
  case 8:
    pGVar12 = (&(&local_60->uv)[1].next)[uVar21 >> 0x17];
    pTVar15 = (pGVar12->p).k;
    pTVar15->value = pTVar14->value;
    iVar7 = pTVar14->tt;
    pTVar15->tt = iVar7;
    if (((3 < iVar7) && (((((pTVar14->value).gc)->gch).marked & 3) != 0)) &&
       (((pGVar12->gch).marked & 4) != 0)) {
      pcStack_80 = (code *)0x11628b;
      luaC_barrierf(L,pGVar12,(pTVar14->value).gc);
      L = local_68;
    }
    goto LAB_001158d9;
  case 9:
    pTVar15 = (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    if ((int)uVar21 < 0) {
      pTVar15 = (TValue *)((long)&local_70->value + (ulong)(uVar21 >> 0x13 & 0xff0));
    }
    if ((uVar21 >> 0x16 & 1) != 0) {
      pTVar16 = local_70;
    }
    L->savedpc = local_78;
    pTVar16 = (StkId)((long)&pTVar16->value + (ulong)(uVar21 >> 10 & 0xff0));
    pTVar13 = pTVar14;
LAB_00115e6c:
    pcStack_80 = (code *)0x115e71;
    luaV_settable(L,pTVar13,pTVar15,pTVar16);
    puVar23 = local_78;
    goto LAB_00116495;
  case 10:
    pcStack_80 = (code *)0x1161f9;
    iVar7 = luaO_fb2int(uVar21 >> 0x17);
    pcStack_80 = (code *)0x116203;
    iVar8 = luaO_fb2int(uVar21 >> 0xe & 0x1ff);
    pcStack_80 = (code *)0x116210;
    pGVar12 = (GCObject *)luaH_new(L,iVar7,iVar8);
    (pTVar14->value).gc = pGVar12;
    pTVar14->tt = 5;
    L->savedpc = local_78;
    puVar23 = local_78;
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      pcStack_80 = (code *)0x11623d;
      luaC_step(L);
      puVar23 = local_78;
    }
    goto LAB_00116495;
  case 0xb:
    uVar11 = (ulong)(uVar21 >> 0x13 & 0xfffffff0);
    pTVar14[1].value = *(Value *)((long)&pTVar16->value + uVar11);
    pTVar14[1].tt = *(int *)((long)&pTVar16->tt + uVar11);
LAB_00116185:
    pTVar15 = (TValue *)((long)&pTVar16->value + uVar11);
    if ((uVar21 >> 0x16 & 1) != 0) {
      pTVar16 = local_70;
    }
    L->savedpc = local_78;
    pTVar13 = (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 10 & 0xff0));
LAB_0011619f:
    pcStack_80 = (code *)0x1161ad;
    luaV_gettable(L,pTVar15,pTVar13,pTVar14);
    puVar23 = local_78;
    goto LAB_00116495;
  case 0xc:
    pTVar13 = (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    if ((int)uVar21 < 0) {
      pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar21 >> 0x13 & 0xff0));
    }
    pTVar17 = local_70;
    if ((uVar21 >> 0x16 & 1) == 0) {
      pTVar17 = pTVar16;
    }
    pTVar15 = (TValue *)((long)&pTVar17->value + (ulong)(uVar21 >> 10 & 0xff0));
    if ((pTVar13->tt == 3) && (pTVar15->tt == 3)) {
      lVar30 = (pTVar13->value).n + (pTVar15->value).n;
LAB_00116168:
      (pTVar14->value).n = lVar30;
      pTVar14->tt = 3;
      goto LAB_001158d9;
    }
    L->savedpc = local_78;
    op = TM_ADD;
    break;
  case 0xd:
    pTVar13 = (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    if ((int)uVar21 < 0) {
      pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar21 >> 0x13 & 0xff0));
    }
    pTVar17 = local_70;
    if ((uVar21 >> 0x16 & 1) == 0) {
      pTVar17 = pTVar16;
    }
    pTVar15 = (TValue *)((long)&pTVar17->value + (ulong)(uVar21 >> 10 & 0xff0));
    if ((pTVar13->tt == 3) && (pTVar15->tt == 3)) {
      lVar30 = (pTVar13->value).n - (pTVar15->value).n;
      goto LAB_00116168;
    }
    L->savedpc = local_78;
    op = TM_SUB;
    break;
  case 0xe:
    pTVar13 = (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    if ((int)uVar21 < 0) {
      pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar21 >> 0x13 & 0xff0));
    }
    pTVar17 = local_70;
    if ((uVar21 >> 0x16 & 1) == 0) {
      pTVar17 = pTVar16;
    }
    pTVar15 = (TValue *)((long)&pTVar17->value + (ulong)(uVar21 >> 10 & 0xff0));
    if ((pTVar13->tt == 3) && (pTVar15->tt == 3)) {
      lVar30 = (pTVar13->value).n * (pTVar15->value).n;
      goto LAB_00116168;
    }
    L->savedpc = local_78;
    op = TM_MUL;
    break;
  case 0xf:
    pTVar13 = (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    if ((int)uVar21 < 0) {
      pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar21 >> 0x13 & 0xff0));
    }
    pTVar17 = local_70;
    if ((uVar21 >> 0x16 & 1) == 0) {
      pTVar17 = pTVar16;
    }
    pTVar15 = (TValue *)((long)&pTVar17->value + (ulong)(uVar21 >> 10 & 0xff0));
    if ((pTVar13->tt == 3) && (pTVar15->tt == 3)) {
      lVar30 = (pTVar13->value).n / (pTVar15->value).n;
      goto LAB_00116168;
    }
    L->savedpc = local_78;
    op = TM_DIV;
    break;
  case 0x10:
    pTVar13 = (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    if ((int)uVar21 < 0) {
      pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar21 >> 0x13 & 0xff0));
    }
    pTVar17 = local_70;
    if ((uVar21 >> 0x16 & 1) == 0) {
      pTVar17 = pTVar16;
    }
    pTVar15 = (TValue *)((long)&pTVar17->value + (ulong)(uVar21 >> 10 & 0xff0));
    if ((pTVar13->tt == 3) && (pTVar15->tt == 3)) {
      local_48 = (pTVar13->value).n;
      local_50 = (pTVar15->value).n;
      pcStack_80 = (code *)0x115b60;
      dVar29 = floor(local_48 / local_50);
      lVar30 = local_48 - dVar29 * local_50;
      L = local_68;
LAB_0011665b:
      (pTVar14->value).n = lVar30;
      pTVar14->tt = 3;
      goto LAB_001158d9;
    }
    L->savedpc = local_78;
    op = TM_MOD;
    break;
  case 0x11:
    pTVar13 = (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    if ((int)uVar21 < 0) {
      pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar21 >> 0x13 & 0xff0));
    }
    pTVar17 = local_70;
    if ((uVar21 >> 0x16 & 1) == 0) {
      pTVar17 = pTVar16;
    }
    pTVar15 = (TValue *)((long)&pTVar17->value + (ulong)(uVar21 >> 10 & 0xff0));
    if ((pTVar13->tt == 3) && (pTVar15->tt == 3)) {
      pcStack_80 = (code *)0x115f8a;
      lVar30 = pow((pTVar13->value).n,(pTVar15->value).n);
      L = local_68;
      goto LAB_00116168;
    }
    L->savedpc = local_78;
    op = TM_POW;
    break;
  case 0x12:
    uVar11 = (ulong)(uVar21 >> 0x13 & 0xfffffff0);
    pTVar15 = (TValue *)((long)&pTVar16->value + uVar11);
    if (*(int *)((long)&pTVar16->tt + uVar11) == 3) {
      (pTVar14->value).gc = (GCObject *)((ulong)(pTVar15->value).gc ^ 0x8000000000000000);
      pTVar14->tt = 3;
      goto LAB_001158d9;
    }
    L->savedpc = local_78;
    op = TM_UNM;
    pTVar13 = pTVar15;
    break;
  case 0x13:
    uVar11 = (ulong)(uVar21 >> 0x13 & 0xfffffff0);
    iVar7 = *(int *)((long)&pTVar16->tt + uVar11);
    if (iVar7 == 0) {
      uVar21 = 1;
    }
    else if (iVar7 == 1) {
      uVar21 = (uint)(*(int *)((long)&pTVar16->value + uVar11) == 0);
    }
    else {
      uVar21 = 0;
    }
    *(uint *)&pTVar14->value = uVar21;
    pTVar14->tt = 1;
    goto LAB_001158d9;
  case 0x14:
    uVar11 = (ulong)(uVar21 >> 0x13 & 0xfffffff0);
    pTVar15 = (TValue *)((long)&pTVar16->value + uVar11);
    iVar7 = *(int *)((long)&pTVar16->tt + uVar11);
    if (iVar7 == 4) {
      uVar1 = *(undefined8 *)((long)(pTVar15->value).gc + 0x10);
      lVar30 = ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      goto LAB_0011665b;
    }
    if (iVar7 == 5) {
      pcStack_80 = (code *)0x116077;
      iVar7 = luaH_getn(&((pTVar15->value).gc)->h);
      lVar30 = (lua_Number)iVar7;
      L = local_68;
      goto LAB_00116168;
    }
    L->savedpc = local_78;
    pcStack_80 = (code *)0x11668a;
    iVar7 = call_binTM(L,pTVar15,&luaO_nilobject_,pTVar14,TM_LEN);
    if (iVar7 == 0) {
      pcStack_80 = (code *)0x1166a4;
      luaG_typeerror(L,pTVar15,"get length of");
    }
    goto LAB_001163f8;
  case 0x15:
    uVar25 = uVar21 >> 0xe & 0x1ff;
    L->savedpc = local_78;
    pcStack_80 = (code *)0x1160dd;
    luaV_concat(L,(uVar25 - (uVar21 >> 0x17)) + 1,uVar25);
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      pcStack_80 = (code *)0x1160f3;
      luaC_step(L);
    }
    pTVar16 = L->base;
    uVar11 = (ulong)((uVar21 >> 0x17) << 4);
    *(undefined8 *)((long)&pTVar16->value + (ulong)(uVar27 << 4)) =
         *(undefined8 *)((long)&pTVar16->value + uVar11);
    *(undefined4 *)((long)&pTVar16->tt + (ulong)(uVar27 << 4)) =
         *(undefined4 *)((long)&pTVar16->tt + uVar11);
    goto LAB_001158d9;
  case 0x16:
    goto switchD_001159f5_caseD_16;
  case 0x17:
    pTVar14 = (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    if ((int)uVar21 < 0) {
      pTVar14 = (TValue *)((long)&local_70->value + (ulong)(uVar21 >> 0x13 & 0xff0));
    }
    if ((uVar21 >> 0x16 & 1) != 0) {
      pTVar16 = local_70;
    }
    uVar11 = (ulong)(uVar21 >> 10 & 0xff0);
    L->savedpc = local_78;
    uVar21 = 0;
    if (pTVar14->tt == *(int *)((long)&pTVar16->tt + uVar11)) {
      pcStack_80 = (code *)0x116376;
      uVar21 = luaV_equalval(L,pTVar14,(TValue *)((long)&pTVar16->value + uVar11));
    }
    goto LAB_0011678d;
  case 0x18:
    pTVar14 = (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    if ((int)uVar21 < 0) {
      pTVar14 = (TValue *)((long)&local_70->value + (ulong)(uVar21 >> 0x13 & 0xff0));
    }
    if ((uVar21 >> 0x16 & 1) != 0) {
      pTVar16 = local_70;
    }
    L->savedpc = local_78;
    pcStack_80 = (code *)0x115d88;
    uVar21 = luaV_lessthan(L,pTVar14,
                           (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 10 & 0xff0)));
    if (uVar21 == uVar27) {
      puVar24 = puVar24 + ((ulong)(*puVar24 >> 0xe) - 0x1ffff);
    }
    goto LAB_001167a3;
  case 0x19:
    L->savedpc = local_78;
    pTVar14 = (TValue *)((long)&pTVar16->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    if ((int)uVar21 < 0) {
      pTVar14 = (TValue *)((long)&local_70->value + (ulong)(uVar21 >> 0x13 & 0xff0));
    }
    if ((uVar21 >> 0x16 & 1) != 0) {
      pTVar16 = local_70;
    }
    uVar11 = (ulong)(uVar21 >> 10 & 0xff0);
    pTVar15 = (TValue *)((long)&pTVar16->value + uVar11);
    iVar7 = pTVar14->tt;
    if (iVar7 == *(int *)((long)&pTVar16->tt + uVar11)) {
      if (iVar7 == 4) {
        pcStack_80 = (code *)0x116731;
        iVar7 = l_strcmp(&((pTVar14->value).gc)->ts,&((pTVar15->value).gc)->ts);
        uVar21 = (uint)(iVar7 < 1);
      }
      else if (iVar7 == 3) {
        uVar21 = (uint)((pTVar14->value).n <= (pTVar15->value).n);
      }
      else {
        pcStack_80 = (code *)0x116751;
        uVar21 = call_orderTM(L,pTVar14,pTVar15,TM_LE);
        if (uVar21 == 0xffffffff) {
          pcStack_80 = (code *)0x11676b;
          iVar7 = call_orderTM(L,pTVar15,pTVar14,TM_LT);
          if (iVar7 == -1) goto LAB_0011677b;
          uVar21 = (uint)(iVar7 == 0);
        }
      }
    }
    else {
LAB_0011677b:
      pcStack_80 = (code *)0x116789;
      uVar21 = luaG_ordererror(L,pTVar14,pTVar15);
    }
LAB_0011678d:
    puVar24 = local_78;
    if (uVar21 == uVar27) {
      puVar24 = local_78 + ((ulong)(*local_78 >> 0xe) - 0x1ffff);
    }
LAB_001167a3:
    pTVar16 = L->base;
    goto LAB_001167a7;
  case 0x1a:
    if (pTVar14->tt == 0) {
      uVar27 = 1;
    }
    else if (pTVar14->tt == 1) {
      uVar27 = (uint)((pTVar14->value).b == 0);
    }
    else {
      uVar27 = 0;
    }
    if (uVar27 != (uVar21 >> 0xe & 0x1ff)) {
LAB_001166d8:
      puVar24 = local_78 + ((ulong)(*local_78 >> 0xe) - 0x1ffff);
    }
    goto LAB_001167a7;
  case 0x1b:
    uVar11 = (ulong)(uVar21 >> 0x13 & 0xfffffff0);
    pVVar5 = (Value *)((long)&pTVar16->value + uVar11);
    iVar7 = *(int *)((long)&pTVar16->tt + uVar11);
    if (iVar7 == 0) {
      uVar27 = 1;
    }
    else {
      uVar27 = 0;
      if (iVar7 == 1) {
        uVar27 = (uint)(pVVar5->b == 0);
      }
    }
    if (uVar27 != (uVar21 >> 0xe & 0x1ff)) {
      pTVar14->value = *pVVar5;
      pTVar14->tt = iVar7;
      goto LAB_001166d8;
    }
    goto LAB_001167a7;
  case 0x1c:
    if (0x7fffff < uVar21) {
      L->top = (StkId)((long)&pTVar14->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    }
    uVar21 = uVar21 >> 0xe & 0x1ff;
    L->savedpc = local_78;
    pcStack_80 = (code *)0x1163ad;
    iVar7 = luaD_precall(L,pTVar14,uVar21 - 1);
    if (iVar7 == 1) {
      if (uVar21 != 0) {
        L->top = L->ci->top;
      }
      goto LAB_001163f8;
    }
    if (iVar7 != 0) {
      return;
    }
    local_54 = local_54 + 1;
    goto LAB_001158b4;
  case 0x1d:
    if (0x7fffff < uVar21) {
      L->top = (StkId)((long)&pTVar14->value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
    }
    L->savedpc = local_78;
    pcStack_80 = (code *)0x1163ef;
    iVar7 = luaD_precall(L,pTVar14,-1);
    if (iVar7 == 1) {
LAB_001163f8:
      pTVar16 = L->base;
      goto LAB_001158d9;
    }
    if (iVar7 != 0) {
      return;
    }
    pCVar6 = L->ci;
    pTVar16 = pCVar6[-1].func;
    pTVar17 = pCVar6->func;
    pTVar19 = pTVar16;
    if (L->openupval != (GCObject *)0x0) {
      pcStack_80 = (code *)0x116839;
      luaF_close(L,pCVar6[-1].base);
      pTVar19 = pCVar6[-1].func;
    }
    pTVar19 = (StkId)(((long)pCVar6->base - (long)pTVar17) + (long)pTVar19);
    pCVar6[-1].base = pTVar19;
    L->base = pTVar19;
    for (; pTVar17 < L->top; pTVar17 = pTVar17 + 1) {
      pTVar16->value = pTVar17->value;
      pTVar16->tt = pTVar17->tt;
      pTVar16 = pTVar16 + 1;
    }
    L->top = pTVar16;
    pCVar6[-1].top = pTVar16;
    pCVar6[-1].savedpc = L->savedpc;
    pCVar6[-1].tailcalls = pCVar6[-1].tailcalls + 1;
    L->ci = L->ci + -1;
    goto LAB_001158b4;
  case 0x1e:
    goto switchD_001159f5_caseD_1e;
  case 0x1f:
    dVar29 = (pTVar14->value).n + pTVar14[2].value.n;
    if (pTVar14[2].value.n <= 0.0) {
      if (dVar29 < pTVar14[1].value.n) goto LAB_001158d9;
    }
    else if (pTVar14[1].value.n < dVar29) goto LAB_001158d9;
    (pTVar14->value).n = dVar29;
    pTVar14->tt = 3;
    pTVar14[3].value.n = dVar29;
    pTVar14[3].tt = 3;
    local_78 = local_78 + ((ulong)(uVar21 >> 0xe) - 0x1ffff);
    goto LAB_001158d9;
  case 0x20:
    pTVar15 = pTVar14 + 2;
    L->savedpc = local_78;
    if (pTVar14->tt == 3) {
LAB_001162bd:
      if (pTVar14[1].tt != 3) {
        pcStack_80 = (code *)0x1162d3;
        pTVar13 = luaV_tonumber(pTVar14 + 1,pTVar14 + 1);
        if (pTVar13 == (TValue *)0x0) {
          pcVar22 = "\'for\' limit must be a number";
          goto LAB_001167b7;
        }
      }
      L = local_68;
      if (pTVar14[2].tt != 3) {
        pcStack_80 = (code *)0x1166fc;
        pTVar15 = luaV_tonumber(pTVar15,pTVar15);
        plStack_a8 = local_68;
        L = local_68;
        if (pTVar15 == (TValue *)0x0) {
          pcVar22 = "\'for\' step must be a number";
          pcStack_80 = Arith;
          L_00 = local_68;
          puVar23 = local_78;
          luaG_runerror(local_68,"\'for\' step must be a number");
          pTStack_a0 = pTVar15;
          pGStack_98 = unaff_R13;
          pTStack_90 = pTVar14;
          uStack_88 = (ulong)uVar27;
          pcStack_80 = (code *)(ulong)uVar21;
          pTVar14 = luaV_tonumber(obj_00,&TStack_b8);
          if ((pTVar14 != (TValue *)0x0) &&
             (pTVar15 = luaV_tonumber((TValue *)obj,&TStack_c8), pTVar15 != (TValue *)0x0)) {
            (*(code *)(&DAT_0011d1ec + *(int *)(&DAT_0011d1ec + (ulong)((TMS)puVar23 - TM_ADD) * 4))
            )((pTVar14->value).gc,(pTVar15->value).gc);
            return;
          }
          iVar7 = call_binTM(L_00,obj_00,(TValue *)obj,(StkId)pcVar22,(TMS)puVar23);
          if (iVar7 == 0) {
            luaG_aritherror(L_00,obj_00,(TValue *)obj);
          }
          return;
        }
      }
    }
    else {
      pcStack_80 = (code *)0x1162ad;
      pTVar13 = luaV_tonumber(pTVar14,pTVar14);
      if (pTVar13 != (TValue *)0x0) goto LAB_001162bd;
      pcVar22 = "\'for\' initial value must be a number";
LAB_001167b7:
      L = local_68;
      pcStack_80 = (code *)0x1167c6;
      luaG_runerror(local_68,pcVar22);
    }
    (pTVar14->value).n = (pTVar14->value).n - (pTVar15->value).n;
    pTVar14->tt = 3;
switchD_001159f5_caseD_16:
    local_78 = local_78 + ((ulong)(uVar21 >> 0xe) - 0x1ffff);
    goto LAB_001158d9;
  case 0x21:
    pTVar14[5].value = pTVar14[2].value;
    pTVar14[5].tt = pTVar14[2].tt;
    pTVar14[4].value = pTVar14[1].value;
    pTVar14[4].tt = pTVar14[1].tt;
    pTVar14[3].value = pTVar14->value;
    pTVar14[3].tt = pTVar14->tt;
    L->top = pTVar14 + 6;
    L->savedpc = local_78;
    pcStack_80 = (code *)0x115eea;
    luaD_call(L,pTVar14 + 3,uVar21 >> 0xe & 0x1ff);
    pTVar16 = L->base;
    L->top = L->ci->top;
    uVar11 = (ulong)(uVar27 << 4);
    iVar7 = *(int *)((long)&pTVar16[3].tt + uVar11);
    if (iVar7 != 0) {
      *(undefined8 *)((long)&pTVar16[2].value + uVar11) =
           *(undefined8 *)((long)&pTVar16[3].value + uVar11);
      *(int *)((long)&pTVar16[2].tt + uVar11) = iVar7;
      puVar24 = puVar24 + ((ulong)(*puVar24 >> 0xe) - 0x1ffff);
    }
LAB_001167a7:
    local_78 = puVar24 + 1;
    goto LAB_001158d9;
  case 0x22:
    if (uVar21 < 0x800000) {
      uVar25 = (int)((ulong)((long)L->top - (long)pTVar14) >> 4) - 1;
      L->top = L->ci->top;
    }
    else {
      uVar25 = uVar21 >> 0x17;
    }
    unaff_R13 = (GCObject *)(ulong)uVar25;
    uVar21 = uVar21 >> 0xe & 0x1ff;
    if (uVar21 == 0) {
      uVar21 = puVar23[1];
      local_78 = puVar23 + 2;
    }
    if (pTVar14->tt == 5) {
      pGVar12 = (pTVar14->value).gc;
      iVar7 = uVar21 * 0x32 + uVar25 + -0x32;
      if ((pGVar12->h).sizearray < iVar7) {
        pcStack_80 = (code *)0x116594;
        luaH_resizearray(L,&pGVar12->h,iVar7);
        L = local_68;
      }
      plVar28 = (long *)((long)&pTVar16[(long)unaff_R13].value + (ulong)(uVar27 << 4));
      while (iVar7 = (int)unaff_R13, 0 < iVar7) {
        pcStack_80 = (code *)0x1165cc;
        pTVar14 = luaH_setnum(L,&pGVar12->h,uVar21 * 0x32 + -0x32 + iVar7);
        (pTVar14->value).gc = (GCObject *)*plVar28;
        lVar20 = plVar28[1];
        pTVar14->tt = (int)lVar20;
        if (((3 < (int)lVar20) && ((*(byte *)(*plVar28 + 9) & 3) != 0)) &&
           (((pGVar12->gch).marked & 4) != 0)) {
          pcStack_80 = (code *)0x1165fb;
          luaC_barrierback(local_68,&pGVar12->h);
        }
        plVar28 = plVar28 + -2;
        L = local_68;
        unaff_R13 = (GCObject *)(ulong)(iVar7 - 1);
      }
    }
    goto LAB_001158d9;
  case 0x23:
    pcStack_80 = (code *)0x115be6;
    luaF_close(L,pTVar14);
    L = local_68;
    goto LAB_001158d9;
  case 0x24:
    pGVar10 = (&(((((local_60->h).node)->i_key).nk.next)->i_val).value)[uVar21 >> 0xe].gc;
    bVar2 = (pGVar10->p).nups;
    pcStack_80 = (code *)0x115a3d;
    pGVar9 = (GCObject *)luaF_newLclosure(L,(uint)bVar2,(Table *)(local_60->h).array);
    (pGVar9->th).l_G = (global_State *)pGVar10;
    puVar23 = local_78;
    for (lVar20 = 0; L = local_68, (ulong)bVar2 * 4 != lVar20; lVar20 = lVar20 + 4) {
      uVar21 = *(uint *)((long)puVar23 + lVar20) >> 0x17;
      if ((*(uint *)((long)puVar23 + lVar20) & 0x3f) == 4) {
        pGVar10 = (&(&pGVar12->uv)[1].next)[uVar21];
      }
      else {
        pcStack_80 = (code *)0x115a7c;
        pGVar10 = (GCObject *)
                  luaF_findupval(local_68,(StkId)((long)&pTVar16->value + (ulong)(uVar21 << 4)));
        puVar23 = local_78;
      }
      *(GCObject **)((long)pGVar9 + lVar20 * 2 + 0x28) = pGVar10;
    }
    (pTVar14->value).gc = pGVar9;
    pTVar14->tt = 6;
    puVar23 = (uint *)((long)puVar23 + lVar20);
    local_68->savedpc = puVar23;
    unaff_R13 = pGVar12;
    if (local_68->l_G->GCthreshold <= local_68->l_G->totalbytes) {
      pcStack_80 = (code *)0x115abf;
      luaC_step(local_68);
    }
    goto LAB_00116495;
  case 0x25:
    unaff_R13 = (GCObject *)L->ci;
    uVar25 = ~(uint)*(byte *)((long)&((local_60->th).l_G)->GCthreshold + 1) +
             (int)((ulong)((long)(unaff_R13->gch).next - *(long *)&(unaff_R13->gch).tt) >> 4);
    if (uVar21 < 0x800000) {
      L->savedpc = local_78;
      if ((long)L->stack_last - (long)L->top <= (long)(int)(uVar25 * 0x10)) {
        pcStack_80 = (code *)0x115ff0;
        luaD_growstack(L,uVar25);
      }
      pTVar16 = L->base;
      pTVar14 = (TValue *)((long)&pTVar16->value + (ulong)(uVar27 << 4));
      L->top = pTVar14 + (int)uVar25;
      uVar21 = uVar25;
    }
    else {
      uVar21 = (uVar21 >> 0x17) - 1;
    }
    uVar18 = 0;
    uVar11 = (ulong)uVar21;
    if ((int)uVar21 < 1) {
      uVar11 = uVar18;
    }
    piVar26 = &pTVar14->tt;
    lVar20 = (long)(int)uVar25 * -0x10;
    for (; uVar11 != uVar18; uVar18 = uVar18 + 1) {
      if ((long)uVar18 < (long)(int)uVar25) {
        pGVar12 = (unaff_R13->gch).next;
        ((TValue *)(piVar26 + -2))->value = *(Value *)((long)pGVar12 + lVar20);
        *piVar26 = *(int *)((long)pGVar12 + lVar20 + 8);
      }
      else {
        *piVar26 = 0;
      }
      piVar26 = piVar26 + 4;
      lVar20 = lVar20 + 0x10;
    }
    goto LAB_001158d9;
  }
  pcStack_80 = (code *)0x116491;
  Arith(L,pTVar14,pTVar13,pTVar15,op);
  puVar23 = local_78;
LAB_00116495:
  pTVar16 = L->base;
  local_78 = puVar23;
  goto LAB_001158d9;
switchD_001159f5_caseD_1e:
  if (0x7fffff < uVar21) {
    L->top = (StkId)((long)&pTVar14[-1].value + (ulong)(uVar21 >> 0x13 & 0xfffffff0));
  }
  if (L->openupval != (GCObject *)0x0) {
    pcStack_80 = (code *)0x11689d;
    luaF_close(L,pTVar16);
  }
  L->savedpc = local_78;
  pcStack_80 = (code *)0x1168b0;
  iVar7 = luaD_poscall(L,pTVar14);
  local_54 = local_54 + -1;
  if (local_54 == 0) {
    return;
  }
  if (iVar7 != 0) {
    L->top = L->ci->top;
  }
  goto LAB_001158b4;
}

Assistant:

void luaV_execute (lua_State *L, int nexeccalls) {
  LClosure *cl;
  StkId base;
  TValue *k;
  const Instruction *pc;
 reentry:  /* entry point */
  lua_assert(isLua(L->ci));
  pc = L->savedpc;
  cl = &clvalue(L->ci->func)->l;
  base = L->base;
  k = cl->p->k;
  /* main loop of interpreter */
  for (;;) {
    const Instruction i = *pc++;
    StkId ra;
    if ((L->hookmask & (LUA_MASKLINE | LUA_MASKCOUNT)) &&
        (--L->hookcount == 0 || L->hookmask & LUA_MASKLINE)) {
      traceexec(L, pc);
      if (L->status == LUA_YIELD) {  /* did hook yield? */
        L->savedpc = pc - 1;
        return;
      }
      base = L->base;
    }
    /* warning!! several calls may realloc the stack and invalidate `ra' */
    ra = RA(i);
    lua_assert(base == L->base && L->base == L->ci->base);
    lua_assert(base <= L->top && L->top <= L->stack + L->stacksize);
    lua_assert(L->top == L->ci->top || luaG_checkopenop(i));
    switch (GET_OPCODE(i)) {
      case OP_MOVE: {
        setobjs2s(L, ra, RB(i));
        continue;
      }
      case OP_LOADK: {
        setobj2s(L, ra, KBx(i));
        continue;
      }
      case OP_LOADBOOL: {
        setbvalue(ra, GETARG_B(i));
        if (GETARG_C(i)) pc++;  /* skip next instruction (if C) */
        continue;
      }
      case OP_LOADNIL: {
        TValue *rb = RB(i);
        do {
          setnilvalue(rb--);
        } while (rb >= ra);
        continue;
      }
      case OP_GETUPVAL: {
        int b = GETARG_B(i);
        setobj2s(L, ra, cl->upvals[b]->v);
        continue;
      }
      case OP_GETGLOBAL: {
        TValue g;
        TValue *rb = KBx(i);
        sethvalue(L, &g, cl->env);
        lua_assert(ttisstring(rb));
        Protect(luaV_gettable(L, &g, rb, ra));
        continue;
      }
      case OP_GETTABLE: {
        Protect(luaV_gettable(L, RB(i), RKC(i), ra));
        continue;
      }
      case OP_SETGLOBAL: {
        TValue g;
        sethvalue(L, &g, cl->env);
        lua_assert(ttisstring(KBx(i)));
        Protect(luaV_settable(L, &g, KBx(i), ra));
        continue;
      }
      case OP_SETUPVAL: {
        UpVal *uv = cl->upvals[GETARG_B(i)];
        setobj(L, uv->v, ra);
        luaC_barrier(L, uv, ra);
        continue;
      }
      case OP_SETTABLE: {
        Protect(luaV_settable(L, ra, RKB(i), RKC(i)));
        continue;
      }
      case OP_NEWTABLE: {
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        sethvalue(L, ra, luaH_new(L, luaO_fb2int(b), luaO_fb2int(c)));
        Protect(luaC_checkGC(L));
        continue;
      }
      case OP_SELF: {
        StkId rb = RB(i);
        setobjs2s(L, ra+1, rb);
        Protect(luaV_gettable(L, rb, RKC(i), ra));
        continue;
      }
      case OP_ADD: {
        arith_op(luai_numadd, TM_ADD);
        continue;
      }
      case OP_SUB: {
        arith_op(luai_numsub, TM_SUB);
        continue;
      }
      case OP_MUL: {
        arith_op(luai_nummul, TM_MUL);
        continue;
      }
      case OP_DIV: {
        arith_op(luai_numdiv, TM_DIV);
        continue;
      }
      case OP_MOD: {
        arith_op(luai_nummod, TM_MOD);
        continue;
      }
      case OP_POW: {
        arith_op(luai_numpow, TM_POW);
        continue;
      }
      case OP_UNM: {
        TValue *rb = RB(i);
        if (ttisnumber(rb)) {
          lua_Number nb = nvalue(rb);
          setnvalue(ra, luai_numunm(nb));
        }
        else {
          Protect(Arith(L, ra, rb, rb, TM_UNM));
        }
        continue;
      }
      case OP_NOT: {
        int res = l_isfalse(RB(i));  /* next assignment may change this value */
        setbvalue(ra, res);
        continue;
      }
      case OP_LEN: {
        const TValue *rb = RB(i);
        switch (ttype(rb)) {
          case LUA_TTABLE: {
            setnvalue(ra, cast_num(luaH_getn(hvalue(rb))));
            break;
          }
          case LUA_TSTRING: {
            setnvalue(ra, cast_num(tsvalue(rb)->len));
            break;
          }
          default: {  /* try metamethod */
            Protect(
              if (!call_binTM(L, rb, luaO_nilobject, ra, TM_LEN))
                luaG_typeerror(L, rb, "get length of");
            )
          }
        }
        continue;
      }
      case OP_CONCAT: {
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        Protect(luaV_concat(L, c-b+1, c); luaC_checkGC(L));
        setobjs2s(L, RA(i), base+b);
        continue;
      }
      case OP_JMP: {
        dojump(L, pc, GETARG_sBx(i));
        continue;
      }
      case OP_EQ: {
        TValue *rb = RKB(i);
        TValue *rc = RKC(i);
        Protect(
          if (equalobj(L, rb, rc) == GETARG_A(i))
            dojump(L, pc, GETARG_sBx(*pc));
        )
        pc++;
        continue;
      }
      case OP_LT: {
        Protect(
          if (luaV_lessthan(L, RKB(i), RKC(i)) == GETARG_A(i))
            dojump(L, pc, GETARG_sBx(*pc));
        )
        pc++;
        continue;
      }
      case OP_LE: {
        Protect(
          if (lessequal(L, RKB(i), RKC(i)) == GETARG_A(i))
            dojump(L, pc, GETARG_sBx(*pc));
        )
        pc++;
        continue;
      }
      case OP_TEST: {
        if (l_isfalse(ra) != GETARG_C(i))
          dojump(L, pc, GETARG_sBx(*pc));
        pc++;
        continue;
      }
      case OP_TESTSET: {
        TValue *rb = RB(i);
        if (l_isfalse(rb) != GETARG_C(i)) {
          setobjs2s(L, ra, rb);
          dojump(L, pc, GETARG_sBx(*pc));
        }
        pc++;
        continue;
      }
      case OP_CALL: {
        int b = GETARG_B(i);
        int nresults = GETARG_C(i) - 1;
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        L->savedpc = pc;
        switch (luaD_precall(L, ra, nresults)) {
          case PCRLUA: {
            nexeccalls++;
            goto reentry;  /* restart luaV_execute over new Lua function */
          }
          case PCRC: {
            /* it was a C function (`precall' called it); adjust results */
            if (nresults >= 0) L->top = L->ci->top;
            base = L->base;
            continue;
          }
          default: {
            return;  /* yield */
          }
        }
      }
      case OP_TAILCALL: {
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        L->savedpc = pc;
        lua_assert(GETARG_C(i) - 1 == LUA_MULTRET);
        switch (luaD_precall(L, ra, LUA_MULTRET)) {
          case PCRLUA: {
            /* tail call: put new frame in place of previous one */
            CallInfo *ci = L->ci - 1;  /* previous frame */
            int aux;
            StkId func = ci->func;
            StkId pfunc = (ci+1)->func;  /* previous function index */
            if (L->openupval) luaF_close(L, ci->base);
            L->base = ci->base = ci->func + ((ci+1)->base - pfunc);
            for (aux = 0; pfunc+aux < L->top; aux++)  /* move frame down */
              setobjs2s(L, func+aux, pfunc+aux);
            ci->top = L->top = func+aux;  /* correct top */
            lua_assert(L->top == L->base + clvalue(func)->l.p->maxstacksize);
            ci->savedpc = L->savedpc;
            ci->tailcalls++;  /* one more call lost */
            L->ci--;  /* remove new frame */
            goto reentry;
          }
          case PCRC: {  /* it was a C function (`precall' called it) */
            base = L->base;
            continue;
          }
          default: {
            return;  /* yield */
          }
        }
      }
      case OP_RETURN: {
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b-1;
        if (L->openupval) luaF_close(L, base);
        L->savedpc = pc;
        b = luaD_poscall(L, ra);
        if (--nexeccalls == 0)  /* was previous function running `here'? */
          return;  /* no: return */
        else {  /* yes: continue its execution */
          if (b) L->top = L->ci->top;
          lua_assert(isLua(L->ci));
          lua_assert(GET_OPCODE(*((L->ci)->savedpc - 1)) == OP_CALL);
          goto reentry;
        }
      }
      case OP_FORLOOP: {
        lua_Number step = nvalue(ra+2);
        lua_Number idx = luai_numadd(nvalue(ra), step); /* increment index */
        lua_Number limit = nvalue(ra+1);
        if (luai_numlt(0, step) ? luai_numle(idx, limit)
                                : luai_numle(limit, idx)) {
          dojump(L, pc, GETARG_sBx(i));  /* jump back */
          setnvalue(ra, idx);  /* update internal index... */
          setnvalue(ra+3, idx);  /* ...and external index */
        }
        continue;
      }
      case OP_FORPREP: {
        const TValue *init = ra;
        const TValue *plimit = ra+1;
        const TValue *pstep = ra+2;
        L->savedpc = pc;  /* next steps may throw errors */
        if (!tonumber(init, ra))
          luaG_runerror(L, LUA_QL("for") " initial value must be a number");
        else if (!tonumber(plimit, ra+1))
          luaG_runerror(L, LUA_QL("for") " limit must be a number");
        else if (!tonumber(pstep, ra+2))
          luaG_runerror(L, LUA_QL("for") " step must be a number");
        setnvalue(ra, luai_numsub(nvalue(ra), nvalue(pstep)));
        dojump(L, pc, GETARG_sBx(i));
        continue;
      }
      case OP_TFORLOOP: {
        StkId cb = ra + 3;  /* call base */
        setobjs2s(L, cb+2, ra+2);
        setobjs2s(L, cb+1, ra+1);
        setobjs2s(L, cb, ra);
        L->top = cb+3;  /* func. + 2 args (state and index) */
        Protect(luaD_call(L, cb, GETARG_C(i)));
        L->top = L->ci->top;
        cb = RA(i) + 3;  /* previous call may change the stack */
        if (!ttisnil(cb)) {  /* continue loop? */
          setobjs2s(L, cb-1, cb);  /* save control variable */
          dojump(L, pc, GETARG_sBx(*pc));  /* jump back */
        }
        pc++;
        continue;
      }
      case OP_SETLIST: {
        int n = GETARG_B(i);
        int c = GETARG_C(i);
        int last;
        Table *h;
        if (n == 0) {
          n = cast_int(L->top - ra) - 1;
          L->top = L->ci->top;
        }
        if (c == 0) c = cast_int(*pc++);
        runtime_check(L, ttistable(ra));
        h = hvalue(ra);
        last = ((c-1)*LFIELDS_PER_FLUSH) + n;
        if (last > h->sizearray)  /* needs more space? */
          luaH_resizearray(L, h, last);  /* pre-alloc it at once */
        for (; n > 0; n--) {
          TValue *val = ra+n;
          setobj2t(L, luaH_setnum(L, h, last--), val);
          luaC_barriert(L, h, val);
        }
        continue;
      }
      case OP_CLOSE: {
        luaF_close(L, ra);
        continue;
      }
      case OP_CLOSURE: {
        Proto *p;
        Closure *ncl;
        int nup, j;
        p = cl->p->p[GETARG_Bx(i)];
        nup = p->nups;
        ncl = luaF_newLclosure(L, nup, cl->env);
        ncl->l.p = p;
        for (j=0; j<nup; j++, pc++) {
          if (GET_OPCODE(*pc) == OP_GETUPVAL)
            ncl->l.upvals[j] = cl->upvals[GETARG_B(*pc)];
          else {
            lua_assert(GET_OPCODE(*pc) == OP_MOVE);
            ncl->l.upvals[j] = luaF_findupval(L, base + GETARG_B(*pc));
          }
        }
        setclvalue(L, ra, ncl);
        Protect(luaC_checkGC(L));
        continue;
      }
      case OP_VARARG: {
        int b = GETARG_B(i) - 1;
        int j;
        CallInfo *ci = L->ci;
        int n = cast_int(ci->base - ci->func) - cl->p->numparams - 1;
        if (b == LUA_MULTRET) {
          Protect(luaD_checkstack(L, n));
          ra = RA(i);  /* previous call may change the stack */
          b = n;
          L->top = ra + n;
        }
        for (j = 0; j < b; j++) {
          if (j < n) {
            setobjs2s(L, ra + j, ci->base - n + j);
          }
          else {
            setnilvalue(ra + j);
          }
        }
        continue;
      }
    }
  }
}